

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadedSharingTest::deinit(GLES2ThreadedSharingTest *this)

{
  deBool dVar1;
  size_type sVar2;
  reference ppEVar3;
  Library *pLVar4;
  TestError *this_00;
  int local_14;
  int threadNdx;
  GLES2ThreadedSharingTest *this_local;
  
  for (local_14 = 0;
      sVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::size(&this->m_threads), local_14 < (int)sVar2; local_14 = local_14 + 1) {
    ppEVar3 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,(long)local_14);
    if (*ppEVar3 != (value_type)0x0) {
      (*((*ppEVar3)->super_Thread).super_Thread._vptr_Thread[1])();
    }
    ppEVar3 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,(long)local_14);
    *ppEVar3 = (value_type)0x0;
  }
  std::
  vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
  ::clear(&this->m_threads);
  if (this->m_eglDisplay != (EGLDisplay)0x0) {
    pLVar4 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
    (*pLVar4->_vptr_Library[0x34])(pLVar4,this->m_eglDisplay);
    this->m_eglDisplay = (EGLDisplay)0x0;
  }
  while ((dVar1 = ::deGetFalse(), dVar1 == 0 && ((this->m_requiresRestart & 1U) == 0))) {
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      return;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"!m_requiresRestart",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
             ,0xe26);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void GLES2ThreadedSharingTest::deinit (void)
{
	for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
	{
		delete m_threads[threadNdx];
		m_threads[threadNdx] = DE_NULL;
	}

	m_threads.clear();

	if (m_eglDisplay != EGL_NO_DISPLAY)
	{
		m_eglTestCtx.getLibrary().terminate(m_eglDisplay);
		m_eglDisplay = EGL_NO_DISPLAY;
	}

	TCU_CHECK(!m_requiresRestart);
}